

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<signed_char,_long>::Run
          (DataTransform<signed_char,_long> *this,istream *input_stream)

{
  int iVar1;
  NumericType NVar2;
  WarningType WVar3;
  ulong uVar4;
  bool bVar5;
  char *__nptr;
  bool bVar6;
  int *piVar7;
  undefined8 uVar8;
  ulong uVar9;
  ostream *poVar10;
  size_t sVar11;
  ulong uVar12;
  int iVar13;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar14;
  char input_data;
  string word;
  char buffer [128];
  char local_271 [3];
  ushort local_26e;
  short local_26c;
  short local_26a;
  string local_268;
  string *local_248;
  ulong local_240;
  ulong local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_248 = &this->print_format_;
  iVar13 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar5 = true;
        bVar6 = false;
      }
      else {
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        *piVar7 = 0;
        strtold(__nptr,(char **)&local_268);
        if (local_268._M_dataplus._M_p == __nptr) {
          uVar8 = std::__throw_invalid_argument("stold");
LAB_00114e7b:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar8);
        }
        if (*piVar7 == 0) {
          *piVar7 = iVar1;
        }
        else if (*piVar7 == 0x22) {
          uVar8 = std::__throw_out_of_range("stold");
          goto LAB_00114e7b;
        }
        local_26e = in_FPUControlWord | 0xc00;
        local_26a = (short)ROUND(in_ST0);
        local_271[0] = (char)local_26a;
        bVar5 = false;
        bVar6 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar6) goto LAB_00114b88;
      if (bVar5) {
        if (bVar5) {
LAB_00114e27:
          bVar6 = true;
          if ((this->is_ascii_output_ == true) && (iVar13 % this->num_column_ != 0)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
LAB_00114e65:
          bVar6 = false;
        }
        return bVar6;
      }
    }
    else {
      bVar6 = sptk::ReadStream<signed_char>(local_271,input_stream);
      if (!bVar6) goto LAB_00114e27;
LAB_00114b88:
      uVar9 = (ulong)local_271[0];
      uVar12 = this->minimum_value_;
      uVar4 = this->maximum_value_;
      if ((long)uVar12 < (long)uVar4) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          local_26c = (short)local_271[0];
          in_ST6 = in_ST5;
          local_238 = uVar12;
          if (((longdouble)(long)uVar12 <= (longdouble)local_26c) &&
             (uVar12 = uVar4, local_240 = uVar4, (longdouble)local_26c <= (longdouble)(long)uVar4))
          goto LAB_00114c1a;
        }
        else if (NVar2 == kUnsignedInteger) {
          if (uVar12 <= uVar9) {
            bVar6 = uVar4 < uVar9;
            uVar12 = uVar4;
            if (!bVar6) {
              uVar12 = uVar9;
            }
            goto LAB_00114c1f;
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_00114c1a;
          if ((long)uVar12 <= (long)uVar9) {
            bVar6 = (long)uVar4 < (long)uVar9;
            uVar12 = uVar4;
            if ((long)uVar9 <= (long)uVar4) {
              uVar12 = uVar9;
            }
            goto LAB_00114c1f;
          }
        }
LAB_00114c50:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"th data is over the range of output type",0x28);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"x2x","");
          sptk::PrintErrorMessage(&local_268,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          if (WVar3 == kExit) goto LAB_00114e65;
        }
      }
      else {
LAB_00114c1a:
        bVar6 = false;
        uVar12 = uVar9;
LAB_00114c1f:
        if ((bVar6) || (this->rounding_ == false)) {
          if (bVar6) goto LAB_00114c50;
        }
        else {
          if (local_271[0] < '\x01') {
            dVar14 = (double)(int)local_271[0] + -0.5;
          }
          else {
            dVar14 = (double)(int)local_271[0] + 0.5;
          }
          uVar12 = (ulong)dVar14;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar6 = sptk::SnPrintf<long>(uVar12,local_248,0x80,local_b8);
        if (!bVar6) goto LAB_00114e65;
        sVar11 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar11);
        if ((iVar13 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          in_ST7 = in_ST6;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar6 = sptk::WriteStream<long>(uVar12,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar6) goto LAB_00114e65;
      }
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }